

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
duckdb::Serializer::WriteValue<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>
          (Serializer *this,vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true> *vec)

{
  bool bVar1;
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  *in_RSI;
  Serializer *in_RDI;
  shared_ptr<duckdb::ColumnStatistics,_true> *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true> *__range2;
  size_type count;
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<const_duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>_>
  local_28;
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  *local_20;
  size_type local_18;
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  *local_10;
  
  local_10 = in_RSI;
  local_18 = ::std::
             vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
             ::size(in_RSI);
  (*(code *)((shared_ptr<duckdb::ColumnStatistics,_true> *)in_RDI->_vptr_Serializer)[4].internal.
            super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            (in_RDI,local_18);
  local_20 = local_10;
  local_28._M_current =
       (shared_ptr<duckdb::ColumnStatistics,_true> *)
       ::std::
       vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  ::std::
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>_>
    ::operator*(&local_28);
    WriteValue<duckdb::ColumnStatistics>
              (in_RDI,(shared_ptr<duckdb::ColumnStatistics,_true> *)in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<const_duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>_>
    ::operator++(&local_28);
  }
  (*(code *)((shared_ptr<duckdb::ColumnStatistics,_true> *)in_RDI->_vptr_Serializer)[4].internal.
            super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)();
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}